

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_context_random_string(unqlite_context *pCtx,char *zBuf,int nBuflen)

{
  if (nBuflen < 3) {
    return -0x18;
  }
  jx9VmRandomString(pCtx->pVm,zBuf,nBuflen);
  return 0;
}

Assistant:

int unqlite_context_random_string(unqlite_context *pCtx, char *zBuf, int nBuflen)
{
	return jx9_context_random_string(pCtx,zBuf,nBuflen);
}